

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer.h
# Opt level: O3

bool __thiscall ModuleWriter::_removeUnusedFromModule(ModuleWriter *this)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  Module *pMVar8;
  Module *pMVar9;
  Module *pMVar10;
  StringRef name;
  Function *func;
  char *keep [1];
  set<llvm::GlobalAlias_*,_std::less<llvm::GlobalAlias_*>,_std::allocator<llvm::GlobalAlias_*>_>
  aliases;
  set<llvm::GlobalVariable_*,_std::less<llvm::GlobalVariable_*>,_std::allocator<llvm::GlobalVariable_*>_>
  globals;
  set<llvm::Function_*,_std::less<llvm::Function_*>,_std::allocator<llvm::Function_*>_> funs;
  Module *local_d8;
  ModuleWriter *local_d0;
  char *local_c8 [1];
  _Rb_tree<llvm::GlobalAlias_*,_llvm::GlobalAlias_*,_std::_Identity<llvm::GlobalAlias_*>,_std::less<llvm::GlobalAlias_*>,_std::allocator<llvm::GlobalAlias_*>_>
  local_c0;
  _Rb_tree<llvm::GlobalVariable_*,_llvm::GlobalVariable_*,_std::_Identity<llvm::GlobalVariable_*>,_std::less<llvm::GlobalVariable_*>,_std::allocator<llvm::GlobalVariable_*>_>
  local_90;
  _Rb_tree<llvm::Function_*,_llvm::Function_*,_std::_Identity<llvm::Function_*>,_std::less<llvm::Function_*>,_std::allocator<llvm::Function_*>_>
  local_60;
  
  local_c8[0] = (this->options->dgOptions).entryFunction._M_dataplus._M_p;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  pMVar9 = this->M;
  pMVar8 = *(Module **)(pMVar9 + 0x20);
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (pMVar8 != pMVar9 + 0x18) {
    do {
      local_d8 = pMVar8 + -0x38;
      if (pMVar8 == (Module *)0x0) {
        local_d8 = (Module *)0x0;
      }
      name = (StringRef)llvm::Value::getName();
      bVar4 = array_match<char_const*[1]>(name,&local_c8);
      if ((!bVar4) && (cVar5 = llvm::Value::hasNUses((uint)local_d8), cVar5 != '\0')) {
        std::
        _Rb_tree<llvm::Function*,llvm::Function*,std::_Identity<llvm::Function*>,std::less<llvm::Function*>,std::allocator<llvm::Function*>>
        ::_M_insert_unique<llvm::Function*const&>
                  ((_Rb_tree<llvm::Function*,llvm::Function*,std::_Identity<llvm::Function*>,std::less<llvm::Function*>,std::allocator<llvm::Function*>>
                    *)&local_60,(Function **)&local_d8);
      }
      pMVar8 = *(Module **)(pMVar8 + 8);
    } while (pMVar8 != pMVar9 + 0x18);
    pMVar9 = this->M;
  }
  pMVar8 = *(Module **)(pMVar9 + 0x10);
  local_d0 = this;
  if (pMVar8 != pMVar9 + 8) {
    do {
      local_d8 = pMVar8 + -0x38;
      if (pMVar8 == (Module *)0x0) {
        local_d8 = (Module *)0x0;
      }
      cVar5 = llvm::Value::hasNUses((uint)local_d8);
      if (cVar5 != '\0') {
        std::
        _Rb_tree<llvm::GlobalVariable*,llvm::GlobalVariable*,std::_Identity<llvm::GlobalVariable*>,std::less<llvm::GlobalVariable*>,std::allocator<llvm::GlobalVariable*>>
        ::_M_insert_unique<llvm::GlobalVariable*const&>
                  ((_Rb_tree<llvm::GlobalVariable*,llvm::GlobalVariable*,std::_Identity<llvm::GlobalVariable*>,std::less<llvm::GlobalVariable*>,std::allocator<llvm::GlobalVariable*>>
                    *)&local_90,(GlobalVariable **)&local_d8);
      }
      pMVar8 = *(Module **)(pMVar8 + 8);
    } while (pMVar8 != pMVar9 + 8);
    pMVar9 = local_d0->M;
  }
  pMVar8 = *(Module **)(pMVar9 + 0x30);
  p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pMVar8 != pMVar9 + 0x28) {
    do {
      pMVar10 = pMVar8 + -0x30;
      if (pMVar8 == (Module *)0x0) {
        pMVar10 = (Module *)0x0;
      }
      cVar5 = llvm::Value::hasNUses((uint)pMVar10);
      if (cVar5 != '\0') {
        local_d8 = pMVar10;
        std::
        _Rb_tree<llvm::GlobalAlias*,llvm::GlobalAlias*,std::_Identity<llvm::GlobalAlias*>,std::less<llvm::GlobalAlias*>,std::allocator<llvm::GlobalAlias*>>
        ::_M_insert_unique<llvm::GlobalAlias*>
                  ((_Rb_tree<llvm::GlobalAlias*,llvm::GlobalAlias*,std::_Identity<llvm::GlobalAlias*>,std::less<llvm::GlobalAlias*>,std::allocator<llvm::GlobalAlias*>>
                    *)&local_c0,(GlobalAlias **)&local_d8);
      }
      pMVar8 = *(Module **)(pMVar8 + 8);
      p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    } while (pMVar8 != pMVar9 + 0x28);
  }
  for (; (_Rb_tree_header *)p_Var6 != p_Var1;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    llvm::Function::eraseFromParent();
  }
  for (p_Var6 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var7 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left,
      (_Rb_tree_header *)p_Var6 != &local_90._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    llvm::GlobalVariable::eraseFromParent();
  }
  for (; (_Rb_tree_header *)p_Var7 != &local_c0._M_impl.super__Rb_tree_header;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    llvm::GlobalAlias::eraseFromParent();
  }
  bVar2 = local_90._M_impl.super__Rb_tree_header._M_node_count != 0;
  bVar3 = local_60._M_impl.super__Rb_tree_header._M_node_count != 0;
  bVar4 = local_c0._M_impl.super__Rb_tree_header._M_node_count != 0;
  std::
  _Rb_tree<llvm::GlobalAlias_*,_llvm::GlobalAlias_*,_std::_Identity<llvm::GlobalAlias_*>,_std::less<llvm::GlobalAlias_*>,_std::allocator<llvm::GlobalAlias_*>_>
  ::_M_erase(&local_c0,(_Link_type)local_c0._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<llvm::GlobalVariable_*,_llvm::GlobalVariable_*,_std::_Identity<llvm::GlobalVariable_*>,_std::less<llvm::GlobalVariable_*>,_std::allocator<llvm::GlobalVariable_*>_>
  ::_M_erase(&local_90,(_Link_type)local_90._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<llvm::Function_*,_llvm::Function_*,_std::_Identity<llvm::Function_*>,_std::less<llvm::Function_*>,_std::allocator<llvm::Function_*>_>
  ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  return (bVar2 || bVar3) || bVar4;
}

Assistant:

bool _removeUnusedFromModule() {
        using namespace llvm;
        // do not slice away these functions no matter what
        // FIXME do it a vector and fill it dynamically according
        // to what is the setup (like for sv-comp or general..)
        const char *keep[] = {options.dgOptions.entryFunction.c_str()};

        // when erasing while iterating the slicer crashes
        // so set the to be erased values into container
        // and then erase them
        std::set<Function *> funs;
        std::set<GlobalVariable *> globals;
        std::set<GlobalAlias *> aliases;

        for (auto &I : *M) {
            Function *func = &I;
            if (array_match(func->getName(), keep))
                continue;

            // if the function is unused or we haven't constructed it
            // at all in dependence graph, we can remove it
            // (it may have some uses though - like when one
            // unused func calls the other unused func
            if (func->hasNUses(0))
                funs.insert(func);
        }

        for (auto I = M->global_begin(), E = M->global_end(); I != E; ++I) {
            GlobalVariable *gv = &*I;
            if (gv->hasNUses(0))
                globals.insert(gv);
        }

        for (GlobalAlias &ga : M->getAliasList()) {
            if (ga.hasNUses(0))
                aliases.insert(&ga);
        }

        for (Function *f : funs)
            f->eraseFromParent();
        for (GlobalVariable *gv : globals)
            gv->eraseFromParent();
        for (GlobalAlias *ga : aliases)
            ga->eraseFromParent();

        return (!funs.empty() || !globals.empty() || !aliases.empty());
    }